

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

any * __thiscall
Omega_h::SemicolonOp::eval(any *__return_storage_ptr__,SemicolonOp *this,ExprEnv *env)

{
  element_type *peVar1;
  undefined1 auStack_38 [16];
  long local_28;
  
  (*((this->lhs).super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ExprOp[2])(auStack_38);
  if (local_28 != 0) {
    (**(code **)(local_28 + 8))(auStack_38);
    local_28 = 0;
  }
  peVar1 = (this->rhs).super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ExprOp[2])(__return_storage_ptr__,peVar1,env);
  return __return_storage_ptr__;
}

Assistant:

any SemicolonOp::eval(ExprEnv& env) {
  lhs->eval(env);  // LHS result ignored
  return rhs->eval(env);
}